

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

object * __thiscall
msgpack::v1::adaptor::convert<std::tuple<person>,_void>::operator()
          (convert<std::tuple<person>,_void> *this,object *o,tuple<person> *v)

{
  undefined8 *puVar1;
  
  if ((o->super_object).type == ARRAY) {
    StdTupleConverter<std::tuple<person>_&,_1UL>::convert(o,v);
    return o;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__bad_cast_0017da08;
  __cxa_throw(puVar1,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

msgpack::object const& operator()(
        msgpack::object const& o,
        std::tuple<Args...>& v) const {
        if(o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        StdTupleConverter<decltype(v), sizeof...(Args)>::convert(o, v);
        return o;
    }